

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
::visit_end_object(basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
                   *this,ser_context *param_2,error_code *param_3)

{
  bool bVar1;
  string *s;
  reference this_00;
  long in_RDI;
  vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
  *in_stack_ffffffffffffffa0;
  assertion_error *this_01;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                   *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (!bVar1) {
    *(int *)(in_RDI + 0x1a0) = *(int *)(in_RDI + 0x1a0) + -1;
    std::
    vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
    ::pop_back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                *)0x9dda61);
    stream_sink<wchar_t>::push_back
              ((stream_sink<wchar_t> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,(wchar_t)((ulong)in_RDI >> 0x20));
    bVar1 = std::
            vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
            ::empty((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                     *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (!bVar1) {
      this_00 = std::
                vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
                ::back(in_stack_ffffffffffffffa0);
      encoding_context::increment_count(this_00);
    }
    return true;
  }
  s = (string *)__cxa_allocate_exception(0x10);
  this_01 = (assertion_error *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  assertion_error::assertion_error(this_01,s);
  __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_end_object(const ser_context&, std::error_code&) final
        {
            JSONCONS_ASSERT(!stack_.empty());
            --nesting_depth_;

            stack_.pop_back();
            sink_.push_back('}');

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }